

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grapheme.cpp
# Opt level: O0

void __thiscall unicpp::grapheme::grapheme(grapheme *this,u32string *codepoints)

{
  value_type c1;
  utf8proc_bool uVar1;
  size_type sVar2;
  reference pvVar3;
  invalid_grapheme_exception *this_00;
  ulong local_28;
  size_t i;
  u32string *puStack_18;
  utf8proc_int32_t state;
  u32string *codepoints_local;
  grapheme *this_local;
  
  puStack_18 = codepoints;
  codepoints_local = &this->m_codepoints;
  std::__cxx11::u32string::u32string((u32string *)this,codepoints);
  i._4_4_ = 0;
  local_28 = 0;
  while( true ) {
    sVar2 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      (&this->m_codepoints);
    if (sVar2 - 1 <= local_28) {
      return;
    }
    pvVar3 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             operator[](&this->m_codepoints,local_28);
    c1 = *pvVar3;
    pvVar3 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             operator[](&this->m_codepoints,local_28 + 1);
    uVar1 = utf8proc_grapheme_break_stateful(c1,*pvVar3,(utf8proc_int32_t *)((long)&i + 4));
    if (uVar1) break;
    local_28 = local_28 + 1;
  }
  this_00 = (invalid_grapheme_exception *)__cxa_allocate_exception(0x10);
  invalid_grapheme_exception::invalid_grapheme_exception
            (this_00,"Found an grapheme break in a grapheme!");
  __cxa_throw(this_00,&invalid_grapheme_exception::typeinfo,
              invalid_grapheme_exception::~invalid_grapheme_exception);
}

Assistant:

grapheme::grapheme(const std::u32string & codepoints) :
    m_codepoints(codepoints)
{
    //Check if it's a single grapheme
    utf8proc_int32_t state = 0;
    for(std::size_t i = 0; i < m_codepoints.size() - 1; ++i)
    {
        if(utf8proc_grapheme_break_stateful(m_codepoints[i], m_codepoints[i + 1], &state))
            throw invalid_grapheme_exception("Found an grapheme break in a grapheme!");
    }
}